

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rcu_list.hpp
# Opt level: O3

void __thiscall
gmlc::libguarded::
rcu_list<std::aligned_storage<256UL,_16UL>::type,_std::mutex,_MockAllocator<std::aligned_storage<256UL,_16UL>::type>_>
::~rcu_list(rcu_list<std::aligned_storage<256UL,_16UL>::type,_std::mutex,_MockAllocator<std::aligned_storage<256UL,_16UL>::type>_>
            *this)

{
  __pointer_type pnVar1;
  __pointer_type pzVar2;
  node *memory;
  __pointer_type memory_00;
  
  memory = (this->m_head)._M_b._M_p;
  while (memory != (node *)0x0) {
    pnVar1 = (memory->next)._M_b._M_p;
    MockAllocator<gmlc::libguarded::rcu_list<std::aligned_storage<256UL,_16UL>::type,_std::mutex,_MockAllocator<std::aligned_storage<256UL,_16UL>::type>_>::node>
    ::deallocate(&this->m_node_alloc,memory,1);
    memory = pnVar1;
  }
  memory_00 = (this->m_zombie_head)._M_b._M_p;
  while ((memory_00 != (zombie_list_node *)0x0 &&
         ((memory_00->owner)._M_b._M_p == (__pointer_type)0x0))) {
    pzVar2 = (memory_00->next)._M_b._M_p;
    MockAllocator<gmlc::libguarded::rcu_list<std::aligned_storage<256UL,_16UL>::type,_std::mutex,_MockAllocator<std::aligned_storage<256UL,_16UL>::type>_>::node>
    ::deallocate(&this->m_node_alloc,memory_00->zombie_node,1);
    MockAllocator<gmlc::libguarded::rcu_list<std::aligned_storage<256UL,_16UL>::type,_std::mutex,_MockAllocator<std::aligned_storage<256UL,_16UL>::type>_>::zombie_list_node>
    ::deallocate(&this->m_zombie_alloc,memory_00,1);
    memory_00 = pzVar2;
  }
  return;
}

Assistant:

rcu_list<T, M, Alloc>::~rcu_list()
{
    node* n = m_head.load();

    while (n != nullptr) {
        node* current = n;
        n = n->next.load();

        node_alloc_trait::destroy(m_node_alloc, current);
        node_alloc_trait::deallocate(m_node_alloc, current, 1);
    }

    zombie_list_node* zn = m_zombie_head.load();

    while (zn != nullptr && zn->owner.load() == nullptr) {
        zombie_list_node* current = zn;
        zn = zn->next.load();

        node_alloc_trait::destroy(m_node_alloc, current->zombie_node);
        node_alloc_trait::deallocate(m_node_alloc, current->zombie_node, 1);

        zombie_alloc_trait::destroy(m_zombie_alloc, current);
        zombie_alloc_trait::deallocate(m_zombie_alloc, current, 1);
    }
}